

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O3

PaError PaUnixThread_NotifyParent(PaUnixThread *self)

{
  char *format;
  
  if (self->parentWaiting == 0) {
    PaUtil_DebugPrint(
                     "Expression \'self->parentWaiting\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/os/unix/pa_unix_util.c\', line: 479\n"
                     );
    return -0x2702;
  }
  if (self->locked == 0) {
    paUtilErr_ = PaUnixMutex_Lock(&self->mtx);
    if (paUtilErr_ < 0) {
      format = 
      "Expression \'PaUnixMutex_Lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/os/unix/pa_unix_util.c\', line: 483\n"
      ;
      goto LAB_001094fe;
    }
    self->locked = 1;
  }
  self->parentWaiting = 0;
  pthread_cond_signal((pthread_cond_t *)&self->cond);
  paUtilErr_ = PaUnixMutex_Unlock(&self->mtx);
  if (-1 < paUtilErr_) {
    self->locked = 0;
    return 0;
  }
  format = 
  "Expression \'PaUnixMutex_Unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/os/unix/pa_unix_util.c\', line: 488\n"
  ;
LAB_001094fe:
  PaUtil_DebugPrint(format);
  return paUtilErr_;
}

Assistant:

PaError PaUnixThread_NotifyParent( PaUnixThread* self )
{
    PaError result = paNoError;
    PA_UNLESS( self->parentWaiting, paInternalError );

    if( !self->locked )
    {
        PA_ENSURE( PaUnixMutex_Lock( &self->mtx ) );
        self->locked = 1;
    }
    self->parentWaiting = 0;
    pthread_cond_signal( &self->cond );
    PA_ENSURE( PaUnixMutex_Unlock( &self->mtx ) );
    self->locked = 0;

error:
    return result;
}